

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::AsyncCapabilityStream::ReadResult> * __thiscall
kj::_::NullableValue<kj::AsyncCapabilityStream::ReadResult>::operator=
          (NullableValue<kj::AsyncCapabilityStream::ReadResult> *this,
          NullableValue<kj::AsyncCapabilityStream::ReadResult> *other)

{
  ReadResult *params;
  NullableValue<kj::AsyncCapabilityStream::ReadResult> *other_local;
  NullableValue<kj::AsyncCapabilityStream::ReadResult> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::AsyncCapabilityStream::ReadResult>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::AsyncCapabilityStream::ReadResult>(&(other->field_1).value);
      ctor<kj::AsyncCapabilityStream::ReadResult,kj::AsyncCapabilityStream::ReadResult>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }